

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Instruction::IsFoldableByFoldVector(Instruction *this)

{
  bool bVar1;
  Op opcode;
  uint32_t id;
  IRContext *pIVar2;
  Instruction *this_00;
  DefUseManager *this_01;
  anon_class_16_2_f1d96849 local_58;
  function<bool_(const_unsigned_int_*)> local_48;
  Instruction *local_28;
  Instruction *type;
  InstructionFolder *folder;
  Instruction *this_local;
  
  folder = (InstructionFolder *)this;
  pIVar2 = context(this);
  this_00 = (Instruction *)IRContext::get_instruction_folder(pIVar2);
  type = this_00;
  opcode = Instruction::opcode(this);
  bVar1 = InstructionFolder::IsFoldableOpcode((InstructionFolder *)this_00,opcode);
  if (bVar1) {
    pIVar2 = context(this);
    this_01 = IRContext::get_def_use_mgr(pIVar2);
    id = type_id(this);
    local_28 = analysis::DefUseManager::GetDef(this_01,id);
    bVar1 = InstructionFolder::IsFoldableVectorType((InstructionFolder *)type,local_28);
    if (bVar1) {
      local_58.folder = (InstructionFolder *)type;
      local_58.this = this;
      std::function<bool(unsigned_int_const*)>::
      function<spvtools::opt::Instruction::IsFoldableByFoldVector()const::__0,void>
                ((function<bool(unsigned_int_const*)> *)&local_48,&local_58);
      this_local._7_1_ = WhileEachInOperand(this,&local_48);
      std::function<bool_(const_unsigned_int_*)>::~function(&local_48);
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Instruction::IsFoldableByFoldVector() const {
  const InstructionFolder& folder = context()->get_instruction_folder();
  if (!folder.IsFoldableOpcode(opcode())) {
    return false;
  }

  Instruction* type = context()->get_def_use_mgr()->GetDef(type_id());
  if (!folder.IsFoldableVectorType(type)) {
    return false;
  }

  // Even if the type of the instruction is foldable, its operands may not be
  // foldable (e.g., comparisons of 64bit types).  Check that all operand types
  // are foldable before accepting the instruction.
  return WhileEachInOperand([&folder, this](const uint32_t* op_id) {
    Instruction* def_inst = context()->get_def_use_mgr()->GetDef(*op_id);
    Instruction* def_inst_type =
        context()->get_def_use_mgr()->GetDef(def_inst->type_id());
    return folder.IsFoldableVectorType(def_inst_type);
  });
}